

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::SourceCodeInfo_Location::MergePartialFromCodedStream
          (SourceCodeInfo_Location *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  Rep *pRVar4;
  Arena *this_03;
  bool bVar5;
  uint32 uVar6;
  string *value;
  Type *pTVar7;
  RepeatedField<int> *pRVar8;
  char *field_name;
  UnknownFieldSet *unknown_fields;
  int iVar9;
  pointer data;
  char cVar10;
  uint tag;
  ulong uVar11;
  
  this_00 = &this->leading_detached_comments_;
  this_01 = &this->trailing_comments_;
  this_02 = &this->leading_comments_;
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ff52e;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ff52e:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    tag = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_001ff5b2_caseD_5;
    cVar10 = (char)uVar11;
    switch((uint)(uVar11 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar10 == '\b') {
        uVar6 = 10;
        pRVar8 = &this->path_;
LAB_001ff711:
        bVar5 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,uVar6,input,pRVar8);
      }
      else {
        pRVar8 = &this->path_;
        if ((tag & 0xff) != 10) break;
LAB_001ff657:
        bVar5 = internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,pRVar8);
      }
      goto LAB_001ff58d;
    case 2:
      if (cVar10 == '\x10') {
        uVar6 = 0x12;
        pRVar8 = &this->span_;
        goto LAB_001ff711;
      }
      pRVar8 = &this->span_;
      if ((tag & 0xff) == 0x12) goto LAB_001ff657;
      break;
    case 3:
      if (cVar10 != '\x1a') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->leading_comments_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar5 = internal::WireFormatLite::ReadBytes(input,this_02->ptr_);
      iVar9 = 6;
      if (!bVar5) goto LAB_001ff7ff;
      data = (this_02->ptr_->_M_dataplus)._M_p;
      iVar9 = (int)this_02->ptr_->_M_string_length;
      field_name = "google.protobuf.SourceCodeInfo.Location.leading_comments";
LAB_001ff7f8:
      internal::WireFormatLite::VerifyUtf8String(data,iVar9,PARSE,field_name);
      goto LAB_001ff7fd;
    case 4:
      if (cVar10 != '\"') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if ((this->trailing_comments_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar5 = internal::WireFormatLite::ReadBytes(input,this_01->ptr_);
      iVar9 = 6;
      if (bVar5) {
        data = (this_01->ptr_->_M_dataplus)._M_p;
        iVar9 = (int)this_01->ptr_->_M_string_length;
        field_name = "google.protobuf.SourceCodeInfo.Location.trailing_comments";
        goto LAB_001ff7f8;
      }
      goto LAB_001ff7ff;
    case 6:
      if (cVar10 == '2') {
        pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar4 == (Rep *)0x0) {
LAB_001ff721:
          internal::RepeatedPtrFieldBase::Reserve
                    (&this_00->super_RepeatedPtrFieldBase,
                     (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_001ff72f:
          pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          pRVar4->allocated_size = pRVar4->allocated_size + 1;
          this_03 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
          if (this_03 == (Arena *)0x0) {
            value = (string *)operator_new(0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
          }
          else {
            value = (string *)
                    Arena::AllocateAligned
                              (this_03,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
            Arena::AddListNode(this_03,value,internal::arena_destruct_object<std::__cxx11::string>);
          }
          pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          iVar9 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
          (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
          pRVar4->elements[iVar9] = value;
        }
        else {
          iVar9 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar4->allocated_size <= iVar9) {
            if (pRVar4->allocated_size ==
                (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_001ff721;
            goto LAB_001ff72f;
          }
          (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
          value = (string *)pRVar4->elements[iVar9];
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,value);
        iVar9 = 6;
        if (bVar5) {
          pTVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->leading_detached_comments_).super_RepeatedPtrFieldBase.
                              current_size_ + -1);
          data = (pTVar7->_M_dataplus)._M_p;
          pTVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->leading_detached_comments_).super_RepeatedPtrFieldBase.
                              current_size_ + -1);
          iVar9 = (int)pTVar7->_M_string_length;
          field_name = "google.protobuf.SourceCodeInfo.Location.leading_detached_comments";
          goto LAB_001ff7f8;
        }
        goto LAB_001ff7ff;
      }
    }
switchD_001ff5b2_caseD_5:
    iVar9 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_001ff58d:
      iVar9 = 6;
      if (bVar5 != false) {
LAB_001ff7fd:
        iVar9 = 0;
      }
    }
LAB_001ff7ff:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool SourceCodeInfo_Location::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.SourceCodeInfo.Location)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10u, input, this->mutable_path())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 span = 2 [packed = true];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_span())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18u, input, this->mutable_span())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string leading_comments = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_leading_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->leading_comments().data(), this->leading_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.SourceCodeInfo.Location.leading_comments");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string trailing_comments = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_trailing_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->trailing_comments().data(), this->trailing_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.SourceCodeInfo.Location.trailing_comments");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string leading_detached_comments = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_leading_detached_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->leading_detached_comments(this->leading_detached_comments_size() - 1).data(),
            this->leading_detached_comments(this->leading_detached_comments_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.SourceCodeInfo.Location)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.SourceCodeInfo.Location)
  return false;
#undef DO_
}